

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,int_const&,int_const&,int_const&>
          (pybind11 *this,int *args_,int *args__1,int *args__2)

{
  undefined8 uVar1;
  runtime_error *this_00;
  long *plVar2;
  long *plVar3;
  long lVar4;
  array<pybind11::object,_3UL> args;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  argtypes;
  long lStack_e8;
  object local_e0 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [3];
  
  plVar2 = &lStack_e8;
  local_e0[0].super_handle.m_ptr = (handle)PyLong_FromSsize_t((long)*args_);
  local_e0[1].super_handle.m_ptr = (handle)PyLong_FromSsize_t((long)*args__1);
  local_e0[2].super_handle.m_ptr = (handle)PyLong_FromSsize_t((long)*args__2);
  lVar4 = 0;
  do {
    plVar2 = plVar2 + 1;
    if (*plVar2 == 0) {
      type_id<int_const&>();
      type_id<int_const&>();
      type_id<int_const&>();
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_c8,"make_tuple(): unable to convert argument of type \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)local_88 - lVar4));
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_a8 = (long *)*plVar2;
      plVar3 = plVar2 + 2;
      if (local_a8 == plVar3) {
        local_98 = *plVar3;
        lStack_90 = plVar2[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *plVar3;
      }
      local_a0 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::runtime_error::runtime_error(this_00,(string *)&local_a8);
      *(undefined ***)this_00 = &PTR__runtime_error_00152260;
      __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x60);
  tuple::tuple((tuple *)this,3);
  lVar4 = 0;
  do {
    uVar1 = *(undefined8 *)((long)&local_e0[0].super_handle.m_ptr + lVar4);
    *(undefined8 *)((long)&local_e0[0].super_handle.m_ptr + lVar4) = 0;
    if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) == 0) {
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/amlucas[P]sdfTools/src/extern/pybind11/include/pybind11/cast.h"
                    ,0x3d9,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <const int &, const int &, const int &>]"
                   );
    }
    *(undefined8 *)(*(long *)this + 0x18 + lVar4) = uVar1;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x18);
  lVar4 = 0x10;
  do {
    object::~object((object *)((long)&local_e0[0].super_handle.m_ptr + lVar4));
    lVar4 = lVar4 + -8;
  } while (lVar4 != -8);
  return (object)(object)this;
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}